

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O1

void ats1h_write(CPUARMState_conflict *env,ARMCPRegInfo_conflict *ri,uint64_t value)

{
  uint64_t uVar1;
  long lVar2;
  bool bVar3;
  
  uVar1 = do_ats_write(env,value,ri->opc2 & MMU_DATA_STORE,ARMMMUIdx_E2);
  if ((env->features >> 0x21 & 1) != 0) {
    if (env->aarch64 == 0) {
      bVar3 = (env->uncached_cpsr & 0x1f) == 0x16;
    }
    else {
      bVar3 = (~env->pstate & 0xc) == 0;
    }
    if (!bVar3) {
      bVar3 = ((env->cp15).scr_el3 & 1) == 0;
    }
    if ((((uint)env->features >> 0x1c & 1) == 0) && (lVar2 = 0x460, bVar3)) goto LAB_0062149b;
  }
  lVar2 = 0x450;
LAB_0062149b:
  *(uint64_t *)((long)env->regs + lVar2) = uVar1;
  return;
}

Assistant:

static void ats1h_write(CPUARMState *env, const ARMCPRegInfo *ri,
                        uint64_t value)
{
    MMUAccessType access_type = ri->opc2 & 1 ? MMU_DATA_STORE : MMU_DATA_LOAD;
    uint64_t par64;

    par64 = do_ats_write(env, value, access_type, ARMMMUIdx_E2);

    A32_BANKED_CURRENT_REG_SET(env, par, par64);
}